

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  stbtt__buf sVar1;
  int end;
  int start;
  int offsize;
  int count;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  stbtt__buf *in_stack_ffffffffffffffc0;
  stbtt__buf *b_00;
  stbtt__buf local_20 [2];
  
  stbtt__buf_seek(local_20,0);
  stbtt__buf_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  stbtt__buf_get8(local_20);
  b_00 = local_20;
  stbtt__buf_skip(b_00,in_stack_ffffffffffffffbc);
  stbtt__buf_get(b_00,in_stack_ffffffffffffffbc);
  stbtt__buf_get(b_00,in_stack_ffffffffffffffbc);
  sVar1 = stbtt__buf_range(b_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  return sVar1;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}